

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase238::run(TestCase238 *this)

{
  Builder builder_00;
  Reader reader_00;
  ReaderOptions options;
  Array<capnp::word> serialized;
  Builder local_2a8;
  TestInputStream stream;
  Reader local_260;
  TestMessageBuilder builder;
  InputStreamMessageReader reader;
  
  TestMessageBuilder::TestMessageBuilder(&builder,1);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_2a8,(MessageBuilder *)&builder);
  builder_00._builder.capTable = local_2a8._builder.capTable;
  builder_00._builder.segment = local_2a8._builder.segment;
  builder_00._builder.data = local_2a8._builder.data;
  builder_00._builder.pointers = local_2a8._builder.pointers;
  builder_00._builder.dataSize = local_2a8._builder.dataSize;
  builder_00._builder.pointerCount = local_2a8._builder.pointerCount;
  builder_00._builder._38_2_ = local_2a8._builder._38_2_;
  initTestMessage(builder_00);
  messageToFlatArray(&serialized,(MessageBuilder *)&builder);
  stream.super_InputStream._vptr_InputStream = (_func_int **)&PTR__BufferedInputStream_003936a0;
  stream.pos = (char *)serialized.ptr;
  stream.end = (char *)(serialized.ptr + serialized.size_);
  stream.lazy = false;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  InputStreamMessageReader::InputStreamMessageReader
            (&reader,&stream.super_InputStream,options,(ArrayPtr<capnp::word>)ZEXT816(0));
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_260,&reader.super_MessageReader);
  reader_00._reader.capTable = local_260._reader.capTable;
  reader_00._reader.segment = local_260._reader.segment;
  reader_00._reader.data = local_260._reader.data;
  reader_00._reader.pointers = local_260._reader.pointers;
  reader_00._reader.dataSize = local_260._reader.dataSize;
  reader_00._reader.pointerCount = local_260._reader.pointerCount;
  reader_00._reader._38_2_ = local_260._reader._38_2_;
  reader_00._reader.nestingLimit = local_260._reader.nestingLimit;
  reader_00._reader._44_4_ = local_260._reader._44_4_;
  checkTestMessage(reader_00);
  InputStreamMessageReader::~InputStreamMessageReader(&reader);
  kj::BufferedInputStream::~BufferedInputStream((BufferedInputStream *)&stream);
  kj::Array<capnp::word>::~Array(&serialized);
  TestMessageBuilder::~TestMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, OrphanageStructCopy) {
  MallocMessageBuilder builder1;
  MallocMessageBuilder builder2;

  auto root1 = builder1.initRoot<TestAllTypes>();
  initTestMessage(root1);

  Orphan<TestAllTypes> orphan = builder2.getOrphanage().newOrphanCopy(root1.asReader());
  checkTestMessage(orphan.getReader());

  auto root2 = builder2.initRoot<TestAllTypes>();
  root2.adoptStructField(kj::mv(orphan));
}